

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.h
# Opt level: O0

Span<unsigned_char> __thiscall
bssl::Span<unsigned_char>::subspan(Span<unsigned_char> *this,size_t pos,size_t len)

{
  uchar *puVar1;
  unsigned_long *puVar2;
  unsigned_long local_38;
  size_t local_30;
  size_t len_local;
  size_t pos_local;
  Span<unsigned_char> *this_local;
  
  local_30 = len;
  len_local = pos;
  pos_local = (size_t)this;
  if (this->size_ < pos) {
    abort();
  }
  puVar1 = this->data_;
  local_38 = this->size_ - pos;
  puVar2 = std::min<unsigned_long>(&local_38,&local_30);
  Span((Span<unsigned_char> *)&this_local,puVar1 + pos,*puVar2);
  return _this_local;
}

Assistant:

constexpr Span subspan(size_t pos = 0, size_t len = npos) const {
    if (pos > size_) {
      // absl::Span throws an exception here. Note std::span and Chromium
      // base::span additionally forbid pos + len being out of range, with a
      // special case at npos/dynamic_extent, while absl::Span::subspan clips
      // the span. For now, we align with absl::Span in case we switch to it in
      // the future.
      abort();
    }
    return Span(data_ + pos, std::min(size_ - pos, len));
  }